

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_countSeqStoreMatchBytes(seqStore_t *seqStore)

{
  seqDef sVar1;
  ushort uStack_2a;
  seqDef seq;
  size_t i;
  size_t nbSeqs;
  size_t matchBytes;
  seqStore_t *seqStore_local;
  
  nbSeqs = 0;
  seq.offset = 0;
  seq.litLength = 0;
  seq.matchLength = 0;
  for (; (ulong)seq < (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
      seq = (seqDef)((long)seq + 1)) {
    uStack_2a = seqStore->sequencesStart[(long)seq].matchLength;
    nbSeqs = (long)(int)(uStack_2a + 3) + nbSeqs;
    sVar1.litLength = 0;
    sVar1.matchLength = 0;
    sVar1.offset = seqStore->longLengthPos;
    if ((seq == sVar1) && (seqStore->longLengthType == ZSTD_llt_matchLength)) {
      nbSeqs = nbSeqs + 0x10000;
    }
  }
  return nbSeqs;
}

Assistant:

static size_t ZSTD_countSeqStoreMatchBytes(const seqStore_t* const seqStore) {
    size_t matchBytes = 0;
    size_t const nbSeqs = seqStore->sequences - seqStore->sequencesStart;
    size_t i;
    for (i = 0; i < nbSeqs; ++i) {
        seqDef seq = seqStore->sequencesStart[i];
        matchBytes += seq.matchLength + MINMATCH;
        if (i == seqStore->longLengthPos && seqStore->longLengthType == ZSTD_llt_matchLength) {
            matchBytes += 0x10000;
        }
    }
    return matchBytes;
}